

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O0

void replay_record_steal_internal(__cilkrts_worker *w,int32_t victim_id)

{
  long in_RDI;
  int in_stack_000001e8;
  int in_stack_000001ec;
  __cilkrts_pedigree *in_stack_000001f0;
  char *in_stack_000001f8;
  __cilkrts_worker *in_stack_00000200;
  
  if (*(long *)(*(long *)(in_RDI + 0x38) + 0x38) == 0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/record-replay.cpp"
                  ,0x14f,"w->l->next_frame_ff");
  }
  if (*(long *)(*(long *)(*(long *)(in_RDI + 0x38) + 0x38) + 0x48) != 0) {
    write_to_replay_log(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001ec,
                        in_stack_000001e8);
    return;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/record-replay.cpp"
                ,0x150,"w->l->next_frame_ff->call_stack");
}

Assistant:

void replay_record_steal_internal(__cilkrts_worker *w, int32_t victim_id)
{
    // Follow the pedigree chain using worker's stack frame
    CILK_ASSERT(w->l->next_frame_ff);
    CILK_ASSERT(w->l->next_frame_ff->call_stack);

    // Record steal: STEAL pedigree victim_id thief_id
    write_to_replay_log (w, PED_TYPE_STR_STEAL,
                         &(w->l->next_frame_ff->call_stack->parent_pedigree),
                         victim_id);
}